

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wln.h
# Opt level: O1

int Wln_ObjRangeEnd(Wln_Ntk_t *p,int i)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  
  if ((-1 < i) && (i < (p->vRanges).nSize)) {
    iVar1 = (p->vRanges).pArray[(uint)i];
    if (-1 < iVar1) {
      pVVar2 = p->pRanges->vObjs;
      uVar3 = iVar1 * 4;
      if ((int)uVar3 < pVVar2->nSize) {
        return pVVar2->pArray[uVar3];
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int          Wln_ObjRangeEnd( Wln_Ntk_t * p, int i )               { return Hash_IntObjData0( p->pRanges, Wln_ObjRangeId(p, i) );               }